

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     Combine<duckdb::ArgMinMaxState<duckdb::date_t,double>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  idx_t iVar6;
  
  if (count != 0) {
    pdVar1 = source->data;
    pdVar2 = target->data;
    iVar6 = 0;
    do {
      pcVar3 = *(char **)(pdVar1 + iVar6 * 8);
      if ((*pcVar3 == '\x01') &&
         ((pcVar4 = *(char **)(pdVar2 + iVar6 * 8), *pcVar4 != '\x01' ||
          (bVar5 = GreaterThan::Operation<double>((double *)(pcVar3 + 8),(double *)(pcVar4 + 8)),
          bVar5)))) {
        *(undefined4 *)(pcVar4 + 4) = *(undefined4 *)(pcVar3 + 4);
        *(undefined8 *)(pcVar4 + 8) = *(undefined8 *)(pcVar3 + 8);
        *pcVar4 = '\x01';
      }
      iVar6 = iVar6 + 1;
    } while (count != iVar6);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}